

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object.hpp
# Opt level: O2

Boxed_Value * __thiscall
chaiscript::dispatch::Dynamic_Object::get_attr(Dynamic_Object *this,string *t_attr_name)

{
  const_iterator cVar1;
  range_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          ::find(&(this->m_attrs)._M_t,t_attr_name);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_attrs)._M_t._M_impl.super__Rb_tree_header) {
    return (Boxed_Value *)(cVar1._M_node + 2);
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_58,"Attr not found \'",t_attr_name);
  std::operator+(&local_38,&bStack_58,"\' and cannot be added to const obj");
  std::range_error::range_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

const Boxed_Value &get_attr(const std::string &t_attr_name) const {
        auto a = m_attrs.find(t_attr_name);

        if (a != m_attrs.end()) {
          return a->second;
        } else {
          throw std::range_error("Attr not found '" + t_attr_name + "' and cannot be added to const obj");
        }
      }